

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextLinux.cpp
# Opt level: O0

void __thiscall
Diligent::GLContext::GLContext
          (GLContext *this,EngineGLCreateInfo *InitAttribs,RENDER_DEVICE_TYPE *DevType,
          Version *APIVersion,SwapChainDesc *param_4)

{
  undefined *puVar1;
  undefined8 uVar2;
  char *in_stack_ffffffffffffff48;
  Diligent *local_a8;
  Version local_9c [3];
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80 [8];
  string _msg;
  Int32 MinorVersion;
  Int32 MajorVersion;
  GLubyte *GLRenderer;
  GLubyte *GLVersionString;
  long lStack_40;
  GLenum err;
  GLXContext CurrentCtx;
  SwapChainDesc *param_4_local;
  Version *APIVersion_local;
  RENDER_DEVICE_TYPE *DevType_local;
  EngineGLCreateInfo *InitAttribs_local;
  GLContext *this_local;
  
  this->m_WindowId = *(Uint32 *)(InitAttribs + 0x78);
  this->m_pDisplay = *(void **)(InitAttribs + 0x80);
  CurrentCtx = (GLXContext)param_4;
  param_4_local = (SwapChainDesc *)APIVersion;
  APIVersion_local = (Version *)DevType;
  DevType_local = (RENDER_DEVICE_TYPE *)InitAttribs;
  InitAttribs_local = (EngineGLCreateInfo *)this;
  lStack_40 = glXGetCurrentContext();
  if (lStack_40 == 0) {
    LogError<true,char[29]>
              (false,"GLContext",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextLinux.cpp"
               ,0x2f,(char (*) [29])"No current GL context found!");
  }
  GLVersionString._4_4_ = glewInit();
  if (GLVersionString._4_4_ != 0) {
    LogError<true,char[26]>
              (false,"GLContext",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextLinux.cpp"
               ,0x35,(char (*) [26])"Failed to initialize GLEW");
  }
  GLRenderer = (GLubyte *)glGetString(0x1f02);
  _MinorVersion = glGetString(0x1f01);
  _msg.field_2._12_4_ = 0;
  _msg.field_2._8_4_ = 0;
  glGetIntegerv(0x821b,(undefined1 *)((long)&_msg.field_2 + 0xc));
  glGetIntegerv(0x821c,(undefined1 *)((long)&_msg.field_2 + 8));
  if (DevType_local[0x1e] == RENDER_DEVICE_TYPE_UNDEFINED) {
    local_a8 = (Diligent *)0xe651e5;
  }
  else {
    local_a8 = (Diligent *)0xe651d1;
  }
  local_81 = 0x2e;
  local_82 = 0x29;
  FormatString<char[20],int,char,int,char[11],unsigned_char_const*,char[3],unsigned_char_const*,char>
            ((string *)local_80,local_a8,(char (*) [20])((long)&_msg.field_2 + 0xc),(int *)&local_81
             ,_msg.field_2._M_local_buf + 8,(int *)" context (",(char (*) [11])&GLRenderer,
             (uchar **)0xf64f1c,(char (*) [3])&MinorVersion,(uchar **)&local_82,
             in_stack_ffffffffffffff48);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(0,uVar2,0);
  }
  std::__cxx11::string::~string((string *)local_80);
  APIVersion_local->Major = 3;
  Version::Version(local_9c,_msg.field_2._12_4_,_msg.field_2._8_4_);
  param_4_local->Width = local_9c[0].Major;
  param_4_local->Height = local_9c[0].Minor;
  return;
}

Assistant:

GLContext::GLContext(const EngineGLCreateInfo& InitAttribs,
                     RENDER_DEVICE_TYPE&       DevType,
                     struct Version&           APIVersion,
                     const struct SwapChainDesc* /*pSCDesc*/) :
    m_WindowId(InitAttribs.Window.WindowId),
    m_pDisplay(InitAttribs.Window.pDisplay)
{
    auto CurrentCtx = glXGetCurrentContext();
    if (CurrentCtx == 0)
    {
        LOG_ERROR_AND_THROW("No current GL context found!");
    }

    // Initialize GLEW
    GLenum err = glewInit();
    if (GLEW_OK != err)
        LOG_ERROR_AND_THROW("Failed to initialize GLEW");

    //Checking GL version
    const GLubyte* GLVersionString = glGetString(GL_VERSION);
    const GLubyte* GLRenderer      = glGetString(GL_RENDERER);

    Int32 MajorVersion = 0, MinorVersion = 0;
    //Or better yet, use the GL3 way to get the version number
    glGetIntegerv(GL_MAJOR_VERSION, &MajorVersion);
    glGetIntegerv(GL_MINOR_VERSION, &MinorVersion);
    LOG_INFO_MESSAGE(InitAttribs.Window.WindowId != 0 ? "Initialized OpenGL " : "Attached to OpenGL ", MajorVersion, '.', MinorVersion, " context (", GLVersionString, ", ", GLRenderer, ')');

    DevType    = RENDER_DEVICE_TYPE_GL;
    APIVersion = Version{static_cast<Uint32>(MajorVersion), static_cast<Uint32>(MinorVersion)};
}